

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode load_cacert_from_memory(X509_STORE *store,curl_blob *ca_info_blob)

{
  int iVar1;
  BIO *bp;
  stack_st_X509_INFO *sk;
  OPENSSL_STACK *pOVar2;
  long *plVar3;
  OPENSSL_sk_freefunc p_Var4;
  X509_INFO *itmp;
  int count;
  int i;
  stack_st_X509_INFO *inf;
  BIO *cbio;
  curl_blob *ca_info_blob_local;
  X509_STORE *store_local;
  
  itmp._0_4_ = 0;
  if (ca_info_blob->len < 0x80000000) {
    bp = BIO_new_mem_buf(ca_info_blob->data,(int)ca_info_blob->len);
    if (bp == (BIO *)0x0) {
      store_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      sk = (stack_st_X509_INFO *)
           PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
      if (sk == (stack_st_X509_INFO *)0x0) {
        BIO_free(bp);
        store_local._4_4_ = CURLE_SSL_CACERT_BADFILE;
      }
      else {
        itmp._4_4_ = 0;
        while( true ) {
          pOVar2 = ossl_check_const_X509_INFO_sk_type(sk);
          iVar1 = OPENSSL_sk_num(pOVar2);
          if (iVar1 <= itmp._4_4_) break;
          pOVar2 = ossl_check_const_X509_INFO_sk_type(sk);
          plVar3 = (long *)OPENSSL_sk_value(pOVar2,itmp._4_4_);
          if (*plVar3 != 0) {
            iVar1 = X509_STORE_add_cert((X509_STORE *)store,(X509 *)*plVar3);
            if (iVar1 == 0) {
              itmp._0_4_ = 0;
              break;
            }
            itmp._0_4_ = (int)itmp + 1;
          }
          if (plVar3[1] != 0) {
            iVar1 = X509_STORE_add_crl((X509_STORE *)store,(X509_CRL *)plVar3[1]);
            if (iVar1 == 0) {
              itmp._0_4_ = 0;
              break;
            }
            itmp._0_4_ = (int)itmp + 1;
          }
          itmp._4_4_ = itmp._4_4_ + 1;
        }
        pOVar2 = ossl_check_X509_INFO_sk_type(sk);
        p_Var4 = ossl_check_X509_INFO_freefunc_type(X509_INFO_free);
        OPENSSL_sk_pop_free(pOVar2,p_Var4);
        BIO_free(bp);
        store_local._4_4_ = CURLE_SSL_CACERT_BADFILE;
        if (0 < (int)itmp) {
          store_local._4_4_ = CURLE_OK;
        }
      }
    }
  }
  else {
    store_local._4_4_ = CURLE_SSL_CACERT_BADFILE;
  }
  return store_local._4_4_;
}

Assistant:

static CURLcode load_cacert_from_memory(X509_STORE *store,
                                        const struct curl_blob *ca_info_blob)
{
  /* these need to be freed at the end */
  BIO *cbio = NULL;
  STACK_OF(X509_INFO) *inf = NULL;

  /* everything else is just a reference */
  int i, count = 0;
  X509_INFO *itmp = NULL;

  if(ca_info_blob->len > (size_t)INT_MAX)
    return CURLE_SSL_CACERT_BADFILE;

  cbio = BIO_new_mem_buf(ca_info_blob->data, (int)ca_info_blob->len);
  if(!cbio)
    return CURLE_OUT_OF_MEMORY;

  inf = PEM_X509_INFO_read_bio(cbio, NULL, NULL, NULL);
  if(!inf) {
    BIO_free(cbio);
    return CURLE_SSL_CACERT_BADFILE;
  }

  /* add each entry from PEM file to x509_store */
  for(i = 0; i < (int)sk_X509_INFO_num(inf); ++i) {
    itmp = sk_X509_INFO_value(inf, (ossl_valsize_t)i);
    if(itmp->x509) {
      if(X509_STORE_add_cert(store, itmp->x509)) {
        ++count;
      }
      else {
        /* set count to 0 to return an error */
        count = 0;
        break;
      }
    }
    if(itmp->crl) {
      if(X509_STORE_add_crl(store, itmp->crl)) {
        ++count;
      }
      else {
        /* set count to 0 to return an error */
        count = 0;
        break;
      }
    }
  }

  sk_X509_INFO_pop_free(inf, X509_INFO_free);
  BIO_free(cbio);

  /* if we did not end up importing anything, treat that as an error */
  return (count > 0) ? CURLE_OK : CURLE_SSL_CACERT_BADFILE;
}